

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O2

int CVApolynomialGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  uint uVar1;
  CVadjMemRec *pCVar2;
  CVdtpntMemRec **ppCVar3;
  CVdtpntMemRec *pCVar4;
  undefined8 *puVar5;
  sunrealtype *psVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  N_Vector **ppp_Var11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double local_b0;
  int newpoint;
  ulong local_a0;
  CVdtpntMemRec **local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  N_Vector local_78;
  N_Vector *local_70;
  ulong local_68;
  ulong local_60;
  sunrealtype local_58;
  long indx;
  double local_48;
  ulong uStack_40;
  
  pCVar2 = cv_mem->cv_adj_mem;
  uVar12 = 0;
  if ((yS != (N_Vector *)0x0) && (uVar12 = 0, pCVar2->ca_IMinterpSensi != 0)) {
    uVar12 = cv_mem->cv_Ns;
  }
  ppCVar3 = pCVar2->dt_mem;
  local_70 = yS;
  local_58 = t;
  iVar7 = CVAfindIndex(cv_mem,t,&indx,&newpoint);
  if (iVar7 != 0) {
    return iVar7;
  }
  local_98 = ppCVar3;
  local_78 = y;
  if (indx == 0) {
    puVar5 = (undefined8 *)(*ppCVar3)->content;
    N_VScale(0x3ff0000000000000,*puVar5,y);
    if ((int)uVar12 < 1) {
      return 0;
    }
    psVar6 = cv_mem->cv_cvals;
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      psVar6[uVar8] = 1.0;
    }
    iVar7 = N_VScaleVectorArray(uVar12,cv_mem->cv_cvals,puVar5[1],local_70);
    goto LAB_0010dd0e;
  }
  local_48 = ABS(ppCVar3[indx]->t - ppCVar3[indx + -1]->t);
  uStack_40 = 0;
  if (pCVar2->ca_tfinal <= pCVar2->ca_tinitial) {
    uVar1 = *(uint *)((long)ppCVar3[indx + -1]->content + 0x10);
    local_b0 = (double)(ulong)uVar1;
    local_a0 = (ulong)(int)uVar1;
    local_88 = (double)(~local_a0 + pCVar2->ca_np);
    if (pCVar2->ca_np - indx <= (long)local_a0) {
      local_88 = (double)(indx - 1);
    }
    if (newpoint == 0) goto LAB_0010dc72;
    if (pCVar2->ca_tinitial < pCVar2->ca_tfinal) goto LAB_0010dba5;
    local_98 = ppCVar3 + ((long)local_88 - 1);
    for (lVar10 = 0; lVar10 <= (long)local_a0; lVar10 = lVar10 + 1) {
      pCVar4 = local_98[lVar10];
      pCVar2->ca_T[lVar10] = pCVar4->t;
      puVar5 = (undefined8 *)pCVar4->content;
      N_VScale(0x3ff0000000000000,*puVar5,pCVar2->ca_Y[lVar10]);
      if (0 < (int)uVar12) {
        psVar6 = cv_mem->cv_cvals;
        for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
          psVar6[uVar8] = 1.0;
        }
        iVar7 = N_VScaleVectorArray(uVar12,cv_mem->cv_cvals,puVar5[1]);
        if (iVar7 != 0) {
          return -0x1c;
        }
      }
    }
LAB_0010ddc1:
    local_68 = 0;
    if (0 < local_b0._0_4_) {
      local_68 = (ulong)local_b0 & 0xffffffff;
    }
    local_60 = (ulong)((int)local_68 + 1);
    ppp_Var11 = pCVar2->ca_YS + 0xc;
    for (uVar9 = 1; uVar8 = local_68, uVar13 = local_a0, uVar9 != local_60; uVar9 = uVar9 + 1) {
      for (; (long)uVar9 <= (long)uVar13; uVar13 = uVar13 - 1) {
        local_98 = (CVdtpntMemRec **)(local_48 / (pCVar2->ca_T[uVar13] - (double)ppp_Var11[uVar13]))
        ;
        local_88 = -(double)local_98;
        uStack_80 = uStack_40 ^ 0x8000000000000000;
        uStack_90 = uStack_40;
        N_VLinearSum(pCVar2->ca_Y[uVar13],pCVar2->ca_Y[uVar13 - 1],pCVar2->ca_Y[uVar13]);
        if ((0 < (int)uVar12) &&
           (iVar7 = N_VLinearSumVectorArray
                              (local_98,local_88,uVar12,pCVar2->ca_YS[uVar13],
                               pCVar2->ca_Y[uVar13 + 0xc]), iVar7 != 0)) {
          return -0x1c;
        }
      }
      ppp_Var11 = ppp_Var11 + -1;
    }
  }
  else {
    local_b0 = (double)(long)*(int *)((long)ppCVar3[indx]->content + 0x10);
    local_88 = local_b0;
    if ((long)local_b0 < indx) {
      local_88 = (double)indx;
    }
    if (newpoint != 0) {
LAB_0010dba5:
      local_a0 = (ulong)SUB84(local_b0,0);
      for (lVar10 = 0; lVar10 <= (long)local_a0; lVar10 = lVar10 + 1) {
        pCVar4 = local_98[(long)local_88 - lVar10];
        pCVar2->ca_T[lVar10] = pCVar4->t;
        puVar5 = (undefined8 *)pCVar4->content;
        N_VScale(0x3ff0000000000000,*puVar5,pCVar2->ca_Y[lVar10]);
        if (0 < (int)uVar12) {
          psVar6 = cv_mem->cv_cvals;
          for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
            psVar6[uVar8] = 1.0;
          }
          iVar7 = N_VScaleVectorArray(uVar12,cv_mem->cv_cvals,puVar5[1]);
          if (iVar7 != 0) {
            return -0x1c;
          }
        }
      }
      goto LAB_0010ddc1;
    }
LAB_0010dc72:
    uVar8 = 0;
    if (0 < local_b0._0_4_) {
      uVar8 = (ulong)local_b0 & 0xffffffff;
    }
  }
  psVar6 = cv_mem->cv_cvals;
  *psVar6 = 1.0;
  dVar14 = 1.0;
  for (uVar9 = 0; (uVar8 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
    dVar14 = (dVar14 * (local_58 - pCVar2->ca_T[uVar9])) / local_48;
    psVar6[uVar9 + 1] = dVar14;
  }
  iVar7 = N_VLinearCombination(local_b0._0_4_ + 1,psVar6,pCVar2->ca_Y,local_78);
  if (iVar7 != 0) {
    return -0x1c;
  }
  if ((int)uVar12 < 1) {
    return 0;
  }
  iVar7 = N_VLinearCombinationVectorArray
                    (uVar12,local_b0._0_4_ + 1,cv_mem->cv_cvals,pCVar2->ca_YS,local_70);
LAB_0010dd0e:
  if (iVar7 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int CVApolynomialGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y,
                             N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int indx, base;
  sunbooleantype newpoint;
  sunrealtype dt, factor;

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &indx, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (indx == 0)
  {
    content = (CVpolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Scaling factor */

  dt = SUNRabs(dt_mem[indx]->t - dt_mem[indx - 1]->t);

  /* Find the direction of the forward integration */

  dir = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = indx;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (indx < order) { base += order - indx; }
  }
  else
  {
    base    = indx - 1;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (ca_mem->ca_np - indx > order) { base -= indx + order - ca_mem->ca_np; }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - 1 + j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);
        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = dt / (ca_mem->ca_T[j] - ca_mem->ca_T[j - i]);
        N_VLinearSum(factor, ca_mem->ca_Y[j], -factor, ca_mem->ca_Y[j - 1],
                     ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          retval = N_VLinearSumVectorArray(NS, factor, ca_mem->ca_YS[j],
                                           -factor, ca_mem->ca_YS[j - 1],
                                           ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
  }

  /* Perform the actual interpolation using nested multiplications */

  cv_mem->cv_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    cv_mem->cv_cvals[i + 1] = cv_mem->cv_cvals[i] * (t - ca_mem->ca_T[i]) / dt;
  }

  retval = N_VLinearCombination(order + 1, cv_mem->cv_cvals, ca_mem->ca_Y, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, cv_mem->cv_cvals,
                                             ca_mem->ca_YS, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}